

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O2

void __thiscall UrsaClient::recv_res(UrsaClient *this,socket_t *socket)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  reference pvVar4;
  reference pbVar5;
  const_reference pvVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  int i;
  int iVar9;
  char *pcVar10;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  res;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> r;
  iteration_proxy_internal __begin4;
  iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  local_108;
  input_adapter local_100;
  string result;
  iterator __end2;
  iteration_proxy_internal __end4;
  iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  local_80;
  _Any_data local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  while (result._M_string_length == 0) {
    s_try_recv<std::__cxx11::string>(&r,socket);
    if (r.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) {
      std::__cxx11::string::_M_assign((string *)&result);
    }
    else {
      check_task_status(this,&this->connection_id);
    }
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&r);
  }
  nlohmann::detail::input_adapter::
  input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_100,&result);
  local_68 = 0;
  uStack_60 = 0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse(&res,&local_100,(parser_callback_t *)&local_78,true);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_100.ia.
              super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  if (this->raw_json == true) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::dump((string_t *)&r,&res,4,' ',false);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&r);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&res,"type");
    bVar1 = nlohmann::operator==<const_char_*,_0>(pvVar4,"select");
    if (bVar1) {
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::find<char_const(&)[9]>
                ((iterator *)&r,
                 (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  *)&res,(char (*) [9])0x18903e);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::end(&__end2,&res);
      bVar1 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)&r,&__end2);
      if (bVar1) {
        pvVar4 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)&res,"result");
        pvVar4 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)pvVar4,"files");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::begin((iterator *)&r,pvVar4);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::end(&__end2,pvVar4);
        while( true ) {
          bVar1 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::operator!=((iterator *)&r,&__end2);
          if (!bVar1) break;
          pbVar5 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   ::operator*((iterator *)&r);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin4,
                     pbVar5);
          poVar3 = std::operator<<((ostream *)&std::cout,(string *)&__begin4);
          std::endl<char,std::char_traits<char>>(poVar3);
          std::__cxx11::string::~string((string *)&__begin4);
          nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator++((iterator *)&r);
        }
        goto LAB_0011d5ed;
      }
    }
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&res,"type");
    bVar1 = nlohmann::operator==<const_char_*,_0>(pvVar4,"topology");
    if (bVar1) {
      pvVar4 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)&res,"result");
      local_80.container =
           nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar4,"datasets");
      nlohmann::detail::
      iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
      ::begin((iteration_proxy_internal *)&r,&local_80);
      nlohmann::detail::
      iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
      ::end((iteration_proxy_internal *)&__end2,&local_80);
      while( true ) {
        bVar1 = nlohmann::detail::
                iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                ::iteration_proxy_internal::operator!=
                          ((iteration_proxy_internal *)&r,(iteration_proxy_internal *)&__end2);
        if (!bVar1) break;
        poVar3 = std::operator<<((ostream *)&std::cout,"dataset ");
        nlohmann::detail::
        iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::iteration_proxy_internal::key((string *)&__begin4,(iteration_proxy_internal *)&r);
        poVar3 = std::operator<<(poVar3,(string *)&__begin4);
        std::operator<<(poVar3," ");
        std::__cxx11::string::~string((string *)&__begin4);
        poVar3 = std::operator<<((ostream *)&std::cout,"[");
        *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 10;
        pbVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)&r);
        pvVar4 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)pbVar5,"file_count");
        iVar2 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::get<int,_int,_0>(pvVar4);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
        std::operator<<(poVar3,"]");
        pbVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)&r);
        local_108.container =
             nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>(pbVar5,"indexes");
        nlohmann::detail::
        iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::begin(&__begin4,&local_108);
        nlohmann::detail::
        iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::end(&__end4,&local_108);
        while( true ) {
          bVar1 = nlohmann::detail::
                  iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                  ::iteration_proxy_internal::operator!=(&__begin4,&__end4);
          if (!bVar1) break;
          poVar3 = std::operator<<((ostream *)&std::cout," (");
          pbVar5 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   ::operator*(&__begin4.anchor);
          pvVar4 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)pbVar5,"type");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_50,pvVar4);
          poVar3 = std::operator<<(poVar3,(string *)&local_50);
          std::operator<<(poVar3,")");
          std::__cxx11::string::~string((string *)&local_50);
          nlohmann::detail::
          iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
          ::iteration_proxy_internal::operator++(&__begin4);
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        nlohmann::detail::
        iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::iteration_proxy_internal::operator++((iteration_proxy_internal *)&r);
      }
      goto LAB_0011d5ed;
    }
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&res,"type");
    bVar1 = nlohmann::operator==<const_char_*,_0>(pvVar4,"status");
    if (bVar1) {
      pvVar4 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)&res,"result");
      local_50._M_dataplus._M_p =
           (pointer)nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                *)pvVar4,"tasks");
      nlohmann::detail::
      iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
      ::begin((iteration_proxy_internal *)&r,
              (iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
               *)&local_50);
      nlohmann::detail::
      iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
      ::end((iteration_proxy_internal *)&__end2,
            (iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
             *)&local_50);
      while( true ) {
        bVar1 = nlohmann::detail::
                iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                ::iteration_proxy_internal::operator!=
                          ((iteration_proxy_internal *)&r,(iteration_proxy_internal *)&__end2);
        if (!bVar1) break;
        pbVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)&r);
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)pbVar5,"work_estimated");
        uVar7 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::get<unsigned_long,_unsigned_long,_0>(pvVar6);
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)pbVar5,"work_done");
        uVar8 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::get<unsigned_long,_unsigned_long,_0>(pvVar6);
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)pbVar5,"id");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::get<unsigned_long,_unsigned_long,_0>(pvVar6);
        if (uVar7 == 0) {
          iVar2 = 0;
        }
        else {
          iVar2 = (int)((uVar8 * 10) / uVar7);
        }
        poVar3 = std::operator<<((ostream *)&std::cout,"task ");
        *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 9;
        std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::operator<<((ostream *)&std::cout," [");
        for (iVar9 = 0; iVar9 != 10; iVar9 = iVar9 + 1) {
          pcVar10 = " ";
          if (iVar9 < iVar2) {
            pcVar10 = "#";
          }
          std::operator<<((ostream *)&std::cout,pcVar10);
        }
        std::operator<<((ostream *)&std::cout,"] ");
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)pbVar5,"request");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin4,
                   pvVar6);
        if (__begin4.anchor.m_it.object_iterator._M_node < (_Base_ptr)0x6f) {
          std::operator<<((ostream *)&std::cout,(string *)&__begin4);
        }
        else {
          std::__cxx11::string::substr((ulong)&__end4,(ulong)&__begin4);
          std::operator<<((ostream *)&std::cout,(string *)&__end4);
          std::__cxx11::string::~string((string *)&__end4);
          std::operator<<((ostream *)&std::cout," (...) ");
          std::__cxx11::string::substr((ulong)&__end4,(ulong)&__begin4);
          std::operator<<((ostream *)&std::cout,(string *)&__end4);
          std::__cxx11::string::~string((string *)&__end4);
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::__cxx11::string::~string((string *)&__begin4);
        nlohmann::detail::
        iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::iteration_proxy_internal::operator++((iteration_proxy_internal *)&r);
      }
      goto LAB_0011d5ed;
    }
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&res,"type");
    bVar1 = nlohmann::operator==<const_char_*,_0>(pvVar4,"error");
    if (bVar1) {
      pvVar4 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)&res,"error");
      pvVar4 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)pvVar4,"message");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&r,pvVar4);
      spdlog::error<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&r);
    }
    else {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::dump((string_t *)&r,&res,4,' ',false);
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)&r);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  std::__cxx11::string::~string((string *)&r);
LAB_0011d5ed:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&res);
  std::__cxx11::string::~string((string *)&result);
  return;
}

Assistant:

void UrsaClient::recv_res(zmq::socket_t *socket) {
    std::string result;
    while (result.empty()) {
        auto r{s_try_recv<std::string>(socket)};
        if (r.has_value()) {
            result = *r;
        } else {
            check_task_status(connection_id);
        }
    }

    auto res = json::parse(result);
    if (this->raw_json) {
        std::cout << res.dump(4) << std::endl;
        return;
    }

    if (res["type"] == "select" && res.find("iterator") == res.end()) {
        for (const auto &file : res["result"]["files"]) {
            std::cout << file.get<std::string>() << std::endl;
        }
    } else if (res["type"] == "topology") {
        for (const auto &item : res["result"]["datasets"].items()) {
            std::cout << "dataset " << item.key() << " ";
            std::cout << "[" << std::setw(10)
                      << item.value()["file_count"].get<int>() << "]";
            for (const auto &ndx : item.value()["indexes"].items()) {
                std::cout << " (" << ndx.value()["type"].get<std::string>()
                          << ")";
            }
            std::cout << std::endl;
        }
    } else if (res["type"] == "status") {
        for (const auto &item : res["result"]["tasks"].items()) {
            const auto &task = item.value();
            uint64_t estimated = task["work_estimated"];
            uint64_t done = task["work_done"];
            uint64_t id = task["id"];
            int done_per_10 = 0;
            if (estimated != 0) {
                done_per_10 = done * 10 / estimated;
            }
            std::cout << "task " << std::setw(9) << id;
            std::cout << " [";
            for (int i = 0; i < 10; i++) {
                std::cout << ((i < done_per_10) ? "#" : " ");
            }
            std::cout << "] ";
            std::string req = task["request"];
            if (req.size() <= 110) {
                std::cout << req;
            } else {
                std::cout << req.substr(0, 53);
                std::cout << " (...) ";
                std::cout << req.substr(req.size() - 50, 50);
            }
            std::cout << std::endl;
        }
    } else if (res["type"] == "error") {
        spdlog::error(res["error"]["message"].get<std::string>());
    } else {
        std::cout << res.dump(4) << std::endl;
    }
}